

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::CWriter::ExportName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view export_name)

{
  char *pcVar1;
  string_view name;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  CWriter *local_28;
  CWriter *this_local;
  string_view export_name_local;
  
  pcVar1 = export_name._M_str;
  this_local = (CWriter *)export_name._M_len;
  local_28 = this;
  export_name_local._M_len = (size_t)pcVar1;
  export_name_local._M_str = (char *)__return_storage_ptr__;
  std::operator+(&local_68,"w2c_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x1f8)
                );
  std::operator+(&local_48,&local_68,'_');
  name._M_str = pcVar1;
  name._M_len = export_name_local._M_len;
  MangleName_abi_cxx11_(&local_88,(CWriter *)this_local,name);
  std::operator+(__return_storage_ptr__,&local_48,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::ExportName(std::string_view export_name) {
  return kSymbolPrefix + module_prefix_ + '_' + MangleName(export_name);
}